

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O1

EntryType * __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::FindOrAddEntry(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
                 *this,void *key)

{
  hash_t targetBucket;
  EntryType *pEVar1;
  
  targetBucket = PrimePolicy::ModPrime((hash_t)((ulong)key >> 4),this->size,this->modFunctionIndex);
  for (pEVar1 = this->table[targetBucket]; (pEVar1 != (EntryType *)0x0 && (pEVar1->key != key));
      pEVar1 = pEVar1->next) {
  }
  if (pEVar1 != (EntryType *)0x0) {
    return pEVar1;
  }
  pEVar1 = AddInternal(this,key,(PinRecord)ZEXT816(0),targetBucket);
  return pEVar1;
}

Assistant:

EntryType * FindOrAddEntry(TKey key)
    {
         uint targetBucket = HashKeyToBucket(key);
         EntryType * entry = FindEntry(key, targetBucket);
         if (entry == nullptr)
         {
            entry = AddInternal(key, TData(), targetBucket);
         }
         return entry;
    }